

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>,1,1,false>,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,1,1,false>,Eigen::internal::assign_op<float,float>>
               (Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false> *dst,
               Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false> *src,
               assign_op<float,_float> *func)

{
  variable_if_dynamic<long,__1> func_00;
  Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false> *dstExpr;
  undefined1 local_78 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_38 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false> *src_local;
  Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false> *dst_local;
  
  srcEvaluator.super_block_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>
  .m_outerStride.m_value = (long)func;
  evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
             local_38,src);
  resize_if_allowed<Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>,1,1,false>,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,1,1,false>,float,float>
            (dst,src,(assign_op<float,_float> *)
                     srcEvaluator.
                     super_block_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false,_true>
                     .
                     super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>
                     .m_outerStride.m_value);
  evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_> *)
             &kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_block_evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>
            .m_outerStride;
  dstExpr = EigenBase<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_78,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_38,
             (assign_op<float,_float> *)func_00.m_value,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_78);
  evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_8,_1,_0,_8,_1>,_1,_1,_false>_> *)
             &kernel.m_dstExpr);
  evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
             local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}